

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionCheck.cpp
# Opt level: O0

void __thiscall AutoHandledExceptionType::~AutoHandledExceptionType(AutoHandledExceptionType *this)

{
  code *pcVar1;
  Data DVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  bool bVar5;
  AutoHandledExceptionType *this_local;
  
  DVar2 = ExceptionCheck::GetData();
  bVar5 = true;
  if (DVar2.handledExceptionType != ExceptionType_DisableCheck) {
    BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
    bVar5 = true;
    if (BVar3 != 0) {
      DVar2 = ExceptionCheck::GetData();
      bVar5 = true;
      if (DVar2.handledExceptionType != ExceptionType_HasStackProbe) {
        DVar2 = ExceptionCheck::GetData();
        bVar5 = (DVar2.handledExceptionType & ExceptionType_JavascriptException) ==
                ExceptionType_JavascriptException;
      }
    }
  }
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x57,
                       "(ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe || (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException)"
                       ,
                       "ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe || (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException"
                      );
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ExceptionCheck::ClearHandledExceptionType();
  return;
}

Assistant:

AutoHandledExceptionType::~AutoHandledExceptionType()
{
    Assert(ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck ||
        !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() ||
        ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe ||
        (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException);
    ExceptionCheck::ClearHandledExceptionType();
}